

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O0

int ConnectP33x(P33X *pP33x,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char local_128 [8];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  P33X *pP33x_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pP33x->szCfgFilePath,0,0x100);
  sprintf(pP33x->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pP33x->szDevPath,0,0x100);
    sprintf(pP33x->szDevPath,"COM1");
    pP33x->BaudRate = 0x2580;
    pP33x->timeout = 1000;
    pP33x->threadperiod = 100;
    pP33x->bSaveRawData = 1;
    pP33x->PressureRef = 1.0;
    pP33x->WaterDensity = 1000.0;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pP33x->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pP33x->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pP33x->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pP33x->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pP33x->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&pP33x->PressureRef);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&pP33x->WaterDensity);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pP33x->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pP33x->threadperiod = 100;
  }
  pP33x->LastPressure = 0.0;
  pP33x->LastTemperature = 0.0;
  iVar1 = OpenRS232Port(&pP33x->RS232Port,pP33x->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pP33x->RS232Port,pP33x->BaudRate,'\0',0,'\b','\0',pP33x->timeout);
    if (iVar1 == 0) {
      iVar1 = InitP33x(pP33x);
      if (iVar1 == 0) {
        printf("P33x connected.\n");
        pP33x_local._4_4_ = 0;
      }
      else {
        printf("Unable to connect to P33x.\n");
        CloseRS232Port(&pP33x->RS232Port);
        pP33x_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a P33x.\n");
      CloseRS232Port(&pP33x->RS232Port);
      pP33x_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a P33x.\n");
    pP33x_local._4_4_ = 1;
  }
  return pP33x_local._4_4_;
}

Assistant:

inline int ConnectP33x(P33X* pP33x, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pP33x->szCfgFilePath, 0, sizeof(pP33x->szCfgFilePath));
	sprintf(pP33x->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pP33x->szDevPath, 0, sizeof(pP33x->szDevPath));
		sprintf(pP33x->szDevPath, "COM1");
		pP33x->BaudRate = 9600;
		pP33x->timeout = 1000;
		pP33x->threadperiod = 100;
		pP33x->bSaveRawData = 1;
		pP33x->PressureRef = 1;
		pP33x->WaterDensity = 1000;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pP33x->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pP33x->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pP33x->PressureRef) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pP33x->WaterDensity) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pP33x->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pP33x->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pP33x->pfSaveFile = NULL;

	pP33x->LastPressure = 0;
	pP33x->LastTemperature = 0;

	if (OpenRS232Port(&pP33x->RS232Port, pP33x->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a P33x.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pP33x->RS232Port, pP33x->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pP33x->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a P33x.\n");
		CloseRS232Port(&pP33x->RS232Port);
		return EXIT_FAILURE;
	}

	if (InitP33x(pP33x) != EXIT_SUCCESS)
	{
		printf("Unable to connect to P33x.\n");
		CloseRS232Port(&pP33x->RS232Port);
		return EXIT_FAILURE;
	}

	printf("P33x connected.\n");

	return EXIT_SUCCESS;
}